

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O2

void __thiscall arith_uint256_tests::divide::test_method(divide *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  char *in_RCX;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  string_view str;
  string_view str_00;
  check_type cVar5;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  char **local_f8;
  assertion_result local_f0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 local_b8 [8];
  element_type *local_b0;
  shared_count sStack_a8;
  assertion_result *local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  char *local_80;
  arith_uint256 D2L;
  arith_uint256 D1L;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = in_RCX;
  str._M_len = (size_t)"AD7133AC1977FA2B7";
  arith_uint256S((arith_uint256 *)&D1L.super_base_uint<256U>,(arith_uint256_tests *)0x11,str);
  str_00._M_str = in_RCX;
  str_00._M_len = (size_t)"ECD751716";
  arith_uint256S(&D2L,(arith_uint256_tests *)0x9,str_00);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x169;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  ::operator/((base_uint<256U> *)local_b8,(base_uint<256U> *)&R1L,&D1L.super_base_uint<256U>);
  base_uint<256u>::ToString_abi_cxx11_((string *)local_98,(base_uint<256U> *)local_b8);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       std::operator==((string *)local_98,
                       "00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a");
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "(R1L / D1L).ToString() == \"00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a\"";
  local_118 = "";
  local_110.m_message.px = (element_type *)((ulong)local_110.m_message.px & 0xffffffffffffff00);
  local_110._0_8_ = &PTR__lazy_ostream_011481f0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_128 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f8 = &local_120;
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_110,1,0,WARN,_cVar5,(size_t)&local_130,0x169);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  std::__cxx11::string::~string((string *)local_98);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16a;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  ::operator/((base_uint<256U> *)local_b8,(base_uint<256U> *)&R1L,&D2L.super_base_uint<256U>);
  base_uint<256u>::ToString_abi_cxx11_((string *)local_98,(base_uint<256U> *)local_b8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((string *)local_98,
                       "000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a");
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "(R1L / D2L).ToString() == \"000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a\"";
  local_118 = "";
  local_110.m_message.px = (element_type *)((ulong)local_110.m_message.px & 0xffffffffffffff00);
  local_110._0_8_ = &PTR__lazy_ostream_011481f0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_158 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f8 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_110,1,0,WARN,_cVar5,(size_t)&local_160,0x16a);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  std::__cxx11::string::~string((string *)local_98);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x16b;
  file_01.m_begin = (iterator)&local_170;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
             msg_01);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)&R1L,(base_uint<256U> *)&OneL);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)::operator==((base_uint<256U> *)local_98,(base_uint<256U> *)&R1L);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "R1L / OneL == R1L";
  local_f0.m_message.px = (element_type *)0xb6cc01;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_188 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_a0 = &local_f0;
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_190,0x16b);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16c;
  file_02.m_begin = (iterator)&local_1a0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)&R1L,(base_uint<256U> *)MaxL);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==((base_uint<256U> *)local_98,(base_uint<256U> *)ZeroL);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "R1L / MaxL == ZeroL";
  local_f0.m_message.px = (element_type *)0xb6cc15;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1b8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_a0 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_1c0,0x16c);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16d;
  file_03.m_begin = (iterator)&local_1d0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
             msg_03);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)MaxL,(base_uint<256U> *)&R1L);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)base_uint<256U>::EqualTo((base_uint<256U> *)local_98,2);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "MaxL / R1L == 2";
  local_f0.m_message.px = (element_type *)0xb6cc25;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1e8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_a0 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_1f0,0x16d);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x16e;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)&R1L,(base_uint<256U> *)ZeroL);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x16e;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffffffffff00);
  local_b0 = (element_type *)0x0;
  sStack_a8.pi_ = (sp_counted_base *)0x0;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_01148af0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "exception uint_error expected but not raised";
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_238 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,(lazy_ostream *)local_98,1,1,WARN,_cVar5,
             (size_t)&local_240,0x16e);
  boost::detail::shared_count::~shared_count(&sStack_a8);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x16f;
  file_06.m_begin = (iterator)&local_280;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_290,
             msg_06);
  ::operator/((base_uint<256U> *)local_b8,(base_uint<256U> *)R2L,&D1L.super_base_uint<256U>);
  base_uint<256u>::ToString_abi_cxx11_((string *)local_98,(base_uint<256U> *)local_b8);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       std::operator==((string *)local_98,
                       "000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5");
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "(R2L / D1L).ToString() == \"000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5\"";
  local_118 = "";
  local_110.m_message.px = (element_type *)((ulong)local_110.m_message.px & 0xffffffffffffff00);
  local_110._0_8_ = &PTR__lazy_ostream_011481f0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_120;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_298 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_110,1,0,WARN,_cVar5,(size_t)&local_2a0,0x16f);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  std::__cxx11::string::~string((string *)local_98);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x170;
  file_07.m_begin = (iterator)&local_2b0;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c0,
             msg_07);
  ::operator/((base_uint<256U> *)local_b8,(base_uint<256U> *)R2L,&D2L.super_base_uint<256U>);
  base_uint<256u>::ToString_abi_cxx11_((string *)local_98,(base_uint<256U> *)local_b8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((string *)local_98,
                       "000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4");
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "(R2L / D2L).ToString() == \"000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4\"";
  local_118 = "";
  local_110.m_message.px = (element_type *)((ulong)local_110.m_message.px & 0xffffffffffffff00);
  local_110._0_8_ = &PTR__lazy_ostream_011481f0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_120;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2c8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_110,1,0,WARN,_cVar5,(size_t)&local_2d0,0x170);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  std::__cxx11::string::~string((string *)local_98);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x171;
  file_08.m_begin = (iterator)&local_2e0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
             msg_08);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)R2L,(base_uint<256U> *)&OneL);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)::operator==((base_uint<256U> *)local_98,(base_uint<256U> *)R2L);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "R2L / OneL == R2L";
  local_f0.m_message.px = (element_type *)0xb6cdca;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_a0 = &local_f0;
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_300,0x171);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x172;
  file_09.m_begin = (iterator)&local_310;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_320,
             msg_09);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)R2L,(base_uint<256U> *)MaxL);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==((base_uint<256U> *)local_98,(base_uint<256U> *)ZeroL);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "R2L / MaxL == ZeroL";
  local_f0.m_message.px = (element_type *)0xb6cdde;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_f0;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_328 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_330,0x172);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x173;
  file_10.m_begin = (iterator)&local_340;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_350,
             msg_10);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)MaxL,(base_uint<256U> *)R2L);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)base_uint<256U>::EqualTo((base_uint<256U> *)local_98,1);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "MaxL / R2L == 1";
  local_f0.m_message.px = (element_type *)0xb6cdee;
  local_b0 = (element_type *)((ulong)local_b0 & 0xffffffffffffff00);
  local_b8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_f0;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_358 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_b8,1,0,WARN,_cVar5,(size_t)&local_360,0x173);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x174;
  file_11.m_begin = (iterator)&local_370;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_380,
             msg_11);
  ::operator/((base_uint<256U> *)local_98,(base_uint<256U> *)R2L,(base_uint<256U> *)ZeroL);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x174;
  file_12.m_begin = (iterator)&local_390;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3a0,
             msg_12);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffffffffff00);
  local_b0 = (element_type *)0x0;
  sStack_a8.pi_ = (sp_counted_base *)0x0;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_01148af0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "exception uint_error expected but not raised";
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3a8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,(lazy_ostream *)local_98,1,1,WARN,_cVar5,
             (size_t)&local_3b0,0x174);
  boost::detail::shared_count::~shared_count(&sStack_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( divide )
{
    arith_uint256 D1L{arith_uint256S("AD7133AC1977FA2B7")};
    arith_uint256 D2L{arith_uint256S("ECD751716")};
    BOOST_CHECK((R1L / D1L).ToString() == "00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a");
    BOOST_CHECK((R1L / D2L).ToString() == "000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a");
    BOOST_CHECK(R1L / OneL == R1L);
    BOOST_CHECK(R1L / MaxL == ZeroL);
    BOOST_CHECK(MaxL / R1L == 2);
    BOOST_CHECK_THROW(R1L / ZeroL, uint_error);
    BOOST_CHECK((R2L / D1L).ToString() == "000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5");
    BOOST_CHECK((R2L / D2L).ToString() == "000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4");
    BOOST_CHECK(R2L / OneL == R2L);
    BOOST_CHECK(R2L / MaxL == ZeroL);
    BOOST_CHECK(MaxL / R2L == 1);
    BOOST_CHECK_THROW(R2L / ZeroL, uint_error);
}